

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O3

istream * operator>>(istream *is,half *h)

{
  unsigned_short uVar1;
  float f;
  float local_1c;
  
  std::istream::_M_extract<float>((float *)is);
  if ((local_1c != 0.0) || (NAN(local_1c))) {
    if (half::_eLut[(uint)local_1c >> 0x17] == 0) {
      uVar1 = half::convert((int)local_1c);
    }
    else {
      uVar1 = half::_eLut[(uint)local_1c >> 0x17] +
              (short)(((uint)local_1c & 0x7fffff) + 0xfff + (uint)(((uint)local_1c >> 0xd & 1) != 0)
                     >> 0xd);
    }
  }
  else {
    uVar1 = (unsigned_short)((uint)local_1c >> 0x10);
  }
  h->_h = uVar1;
  return is;
}

Assistant:

HALF_EXPORT istream &
operator >> (istream &is, half &h)
{
    float f;
    is >> f;
    h = half (f);
    return is;
}